

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

char * S2::internal::GetIntersectionMethodName(IntersectionMethod method)

{
  char *pcStack_10;
  IntersectionMethod method_local;
  
  switch(method) {
  case SIMPLE:
    pcStack_10 = "Simple";
    break;
  case SIMPLE_LD:
    pcStack_10 = "Simple_ld";
    break;
  case STABLE:
    pcStack_10 = "Stable";
    break;
  case STABLE_LD:
    pcStack_10 = "Stable_ld";
    break;
  case EXACT:
    pcStack_10 = "Exact";
    break;
  default:
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

const char* GetIntersectionMethodName(IntersectionMethod method) {
  switch (method) {
    case IntersectionMethod::SIMPLE:    return "Simple";
    case IntersectionMethod::SIMPLE_LD: return "Simple_ld";
    case IntersectionMethod::STABLE:    return "Stable";
    case IntersectionMethod::STABLE_LD: return "Stable_ld";
    case IntersectionMethod::EXACT:     return "Exact";
    default:                            return "Unknown";
  }
}